

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,string *struct_type_suffix)

{
  BaseType BVar1;
  EnumDef *pEVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  Type local_50;
  
  pEVar2 = type->enum_def;
  BVar1 = type->base_type;
  if (pEVar2 == (EnumDef *)0x0) {
    switch(BVar1) {
    case BASE_TYPE_BOOL:
      __s = "bool";
      break;
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      __s = "int";
      break;
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE:
      __s = "double";
      break;
    case BASE_TYPE_STRING:
      __s = "String";
      break;
    case BASE_TYPE_VECTOR:
      goto switchD_001897c8_caseD_e;
    case BASE_TYPE_STRUCT:
      (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_90,&this->namer_,type->struct_def);
      std::operator+(&local_b0,&local_90,struct_type_suffix);
      MaybeWrapNamespace(__return_storage_ptr__,this,&local_b0,current_namespace,def);
      std::__cxx11::string::~string((string *)&local_b0);
      this_00 = &local_90;
      goto LAB_00189913;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_dart.cpp"
                    ,0x18b,
                    "std::string flatbuffers::dart::DartGenerator::GenDartTypeName(const Type &, Namespace *, const FieldDef &, std::string)"
                   );
    }
LAB_001898b2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_b0);
    return __return_storage_ptr__;
  }
  if ((BVar1 != BASE_TYPE_UNION & pEVar2->is_union) == 1) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_b0,&this->namer_);
    std::operator+(__return_storage_ptr__,&local_b0,"TypeId");
    this_00 = &local_b0;
    goto LAB_00189913;
  }
  if (pEVar2->is_union != false) {
    __s = "dynamic";
    goto LAB_001898b2;
  }
  if (BVar1 != BASE_TYPE_VECTOR) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(__return_storage_ptr__,&this->namer_);
    return __return_storage_ptr__;
  }
switchD_001897c8_caseD_e:
  local_50.base_type = type->element;
  local_50.struct_def = type->struct_def;
  local_50.fixed_length = type->fixed_length;
  local_50.element = BASE_TYPE_NONE;
  local_50.enum_def = pEVar2;
  std::__cxx11::string::string((string *)&local_70,(string *)struct_type_suffix);
  GenDartTypeName(&local_90,this,&local_50,current_namespace,def,&local_70);
  std::operator+(&local_b0,"List<",&local_90);
  std::operator+(__return_storage_ptr__,&local_b0,">");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  this_00 = &local_70;
LAB_00189913:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def,
                              std::string struct_type_suffix = "") {
    if (type.enum_def) {
      if (type.enum_def->is_union && type.base_type != BASE_TYPE_UNION) {
        return namer_.Type(*type.enum_def) + "TypeId";
      } else if (type.enum_def->is_union) {
        return "dynamic";
      } else if (type.base_type != BASE_TYPE_VECTOR) {
        return namer_.Type(*type.enum_def);
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "bool";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR: return "int";
      case BASE_TYPE_FLOAT:
      case BASE_TYPE_DOUBLE: return "double";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_STRUCT:
        return MaybeWrapNamespace(
            namer_.Type(*type.struct_def) + struct_type_suffix,
            current_namespace, def);
      case BASE_TYPE_VECTOR:
        return "List<" +
               GenDartTypeName(type.VectorType(), current_namespace, def,
                               struct_type_suffix) +
               ">";
      default: assert(0); return "dynamic";
    }
  }